

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void do_delete_class_proc(Am_Object param_1)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_String class_name;
  Am_Object cls;
  Am_Value_List l;
  Am_String local_50;
  Am_String local_48;
  Am_Object local_40;
  Am_Value_List local_38 [16];
  Am_Object local_28;
  
  pAVar1 = (Am_Value *)Am_Object::Get(0x510,0x169);
  Am_Object::Am_Object(&local_40,pAVar1);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&local_40,(ulong)(ushort)CLASS_NAME);
  Am_String::Am_String(&local_48,pAVar1);
  Am_String::Am_String(&local_50,&local_48);
  Am_Gesture_Trainer::Delete_Class((Am_String)0x110580,SUB81(&local_50,0));
  Am_String::~Am_String(&local_50);
  pAVar1 = (Am_Value *)Am_Object::Get(0x510,0xa2);
  Am_Value_List::Am_Value_List(local_38,pAVar1);
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(&local_28,pAVar1);
    cVar2 = Am_Object::operator==(&local_28,&local_40);
    Am_Object::~Am_Object(&local_28);
    if (cVar2 != '\0') {
      Am_Value_List::Delete(SUB81(local_38,0));
    }
    Am_Value_List::Next();
  }
  Am_Object::Note_Changed(0x510);
  Am_Object::Set(0x510,0x169,0);
  Am_Object::Set(0x560,(Am_String *)0x169,0x110570);
  dirty = true;
  Am_Value_List::~Am_Value_List(local_38);
  Am_String::~Am_String(&local_48);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_delete_class, (Am_Object /*cmd*/))
{
  Am_Object cls = class_panel.Get(Am_VALUE);
  Am_String class_name = cls.Get(CLASS_NAME);

  trainer.Delete_Class(class_name);

  Am_Value_List l = class_panel.Get(Am_ITEMS);
  for (l.Start(); !l.Last(); l.Next())
    if (Am_Object(l.Get()) == cls)
      l.Delete(false);
  class_panel.Note_Changed(Am_ITEMS);

  class_panel.Set(Am_VALUE, 0);

  mode.Set(Am_VALUE, training_mode);

  // the classifier has changed, so set dirty flag
  dirty = true;
}